

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DOMLSParserImpl::canSetParameter(DOMLSParserImpl *this)

{
  void *in_RDX;
  XMLCh *in_RSI;
  
  canSetParameter((DOMLSParserImpl *)&this[-1].super_AbstractDOMParser.fDocumentType,in_RSI,in_RDX);
  return;
}

Assistant:

bool DOMLSParserImpl::canSetParameter(const XMLCh* name, const void* /*value*/) const
{
    if (XMLString::compareIStringASCII(name, XMLUni::fgDOMResourceResolver) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgDOMErrorHandler) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesEntityResolver) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesSchemaExternalSchemaLocation) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesSchemaExternalNoNameSpaceSchemaLocation) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesSecurityManager) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesScannerName) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesParserUseDocumentFromImplementation) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesLowWaterMark) == 0)
      return true;
    else if(XMLString::compareIStringASCII(name, XMLUni::fgDOMSchemaLocation) == 0 ||
            XMLString::compareIStringASCII(name, XMLUni::fgDOMSchemaType) == 0)
      return false;

    return false;
}